

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O0

void __thiscall
solitaire::graphics::SDLGraphicsSystemWithLoadedTexture_renderTextureSuccessfully_Test::TestBody
          (SDLGraphicsSystemWithLoadedTexture_renderTextureSuccessfully_Test *this)

{
  WrapperMock *this_00;
  MockSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  *this_01;
  TypedExpectation<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  *this_02;
  SDL_Rect gmock_p0;
  SDL_Rect gmock_p0_00;
  TextureId local_184;
  ReturnAction<int> local_180;
  Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  local_170;
  WithoutMatchers local_149;
  undefined8 local_148;
  undefined8 uStack_140;
  MatcherBaseImpl local_130 [16];
  Matcher<const_std::optional<SDL_Rect>_&> local_120;
  undefined8 local_108;
  undefined8 uStack_100;
  MatcherBaseImpl local_f0 [16];
  Matcher<const_std::optional<SDL_Rect>_&> local_e0;
  SDL_Texture_conflict *local_b8;
  Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&> local_b0;
  SDL_Renderer_conflict *local_98;
  Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&> local_90;
  MockSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  local_78;
  SDLGraphicsSystemWithLoadedTexture_renderTextureSuccessfully_Test *local_10;
  SDLGraphicsSystemWithLoadedTexture_renderTextureSuccessfully_Test *this_local;
  
  local_10 = this;
  this_00 = &mock_ptr<testing::StrictMock<solitaire::SDL::WrapperMock>_>::operator*
                       (&(this->super_SDLGraphicsSystemWithLoadedTexture).
                         super_SDLGraphicsSystemWithCreatedWindowTests.super_SDLGraphicsSystemTests.
                         sdlMock)->super_WrapperMock;
  local_98 = (SDL_Renderer_conflict *)
             testing::no_adl::Pointer<SDL_Renderer*>
                       ((Snapshot **)&(anonymous_namespace)::rendererPtr);
  testing::internal::PointerMatcher::operator_cast_to_Matcher(&local_90,(PointerMatcher *)&local_98)
  ;
  local_b8 = (SDL_Texture_conflict *)
             testing::no_adl::Pointer<SDL_Texture*>
                       ((Snapshot **)&(anonymous_namespace)::texture0Ptr);
  testing::internal::PointerMatcher::operator_cast_to_Matcher(&local_b0,(PointerMatcher *)&local_b8)
  ;
  local_108 = 0xf0000000a;
  uStack_100 = 0x1e00000014;
  gmock_p0.w = 10;
  gmock_p0.h = 0xf;
  gmock_p0._0_8_ = local_f0;
  anon_unknown_0::IsOptionalEq<SDL_Rect>(gmock_p0);
  testing::internal::MatcherBaseImpl::operator_cast_to_Matcher(&local_e0,local_f0);
  local_148 = 0x110000000d;
  uStack_140 = 0x1e00000014;
  gmock_p0_00.w = 0xd;
  gmock_p0_00.h = 0x11;
  gmock_p0_00._0_8_ = local_130;
  anon_unknown_0::IsOptionalEq<SDL_Rect>(gmock_p0_00);
  testing::internal::MatcherBaseImpl::operator_cast_to_Matcher(&local_120,local_130);
  SDL::WrapperMock::gmock_renderCopy(&local_78,this_00,&local_90,&local_b0,&local_e0,&local_120);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
            ::operator()(&local_78,&local_149,(void *)0x0);
  this_02 = testing::internal::
            MockSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
            ::InternalExpectedAt
                      (this_01,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                       ,0x16b,"*sdlMock",
                       "renderCopy(Pointer(rendererPtr), Pointer(texture0Ptr), IsOptionalEq(srcRect), IsOptionalEq(dstRect))"
                      );
  testing::Return<int>((testing *)&local_180,0);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_170,(ReturnAction *)&local_180);
  testing::internal::
  TypedExpectation<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  ::WillOnce(this_02,&local_170);
  testing::
  Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  ::~Action(&local_170);
  testing::internal::ReturnAction<int>::~ReturnAction(&local_180);
  testing::internal::
  MockSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  ::~MockSpec(&local_78);
  testing::Matcher<const_std::optional<SDL_Rect>_&>::~Matcher(&local_120);
  testing::Matcher<const_std::optional<SDL_Rect>_&>::~Matcher(&local_e0);
  testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>::
  ~Matcher(&local_b0);
  testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>::
  ~Matcher(&local_90);
  TextureId::TextureId(&local_184,(TextureId *)&(anonymous_namespace)::textureId0);
  SDLGraphicsSystem::renderTexture
            (&(this->super_SDLGraphicsSystemWithLoadedTexture).
              super_SDLGraphicsSystemWithCreatedWindowTests.super_SDLGraphicsSystemTests.system,
             &local_184,(Position *)&(anonymous_namespace)::texturePosition,
             (Area *)(anonymous_namespace)::textureArea);
  SDLGraphicsSystemWithLoadedTexture::expectQuitSystemWithLoadedTexture
            (&this->super_SDLGraphicsSystemWithLoadedTexture);
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemWithLoadedTexture, renderTextureSuccessfully) {
    EXPECT_CALL(*sdlMock,
        renderCopy(Pointer(rendererPtr), Pointer(texture0Ptr),
                   IsOptionalEq(srcRect), IsOptionalEq(dstRect))
    ).WillOnce(Return(success));

    system.renderTexture(textureId0, texturePosition, textureArea);
    expectQuitSystemWithLoadedTexture();
}